

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O1

int rtr_mgr_for_each_group
              (rtr_mgr_config *config,_func_void_rtr_mgr_group_ptr_void_ptr *fp,void *data)

{
  long lVar1;
  tommy_list ptVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (ptVar2 = config->groups->list; ptVar2 != (tommy_list)0x0; ptVar2 = ptVar2->next) {
    (*fp)(*(rtr_mgr_group **)((long)ptVar2->data + 0x20),data);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_for_each_group(struct rtr_mgr_config *config,
					 void(fp)(const struct rtr_mgr_group *group, void *data), void *data)
{
	tommy_node *node = tommy_list_head(&config->groups->list);

	while (node) {
		struct rtr_mgr_group_node *group_node = node->data;

		fp(group_node->group, data);
		node = node->next;
	}

	return RTR_SUCCESS;
}